

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.h
# Opt level: O0

base_uint<256U> * __thiscall base_uint<256U>::operator-=(base_uint<256U> *this,base_uint<256U> *b)

{
  long lVar1;
  base_uint<256U> *in_RDI;
  long in_FS_OFFSET;
  base_uint<256U> *b_00;
  base_uint<256U> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  b_00 = in_RDI;
  operator-(in_RDI);
  operator+=(in_stack_ffffffffffffffd8,b_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

base_uint& operator-=(const base_uint& b)
    {
        *this += -b;
        return *this;
    }